

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

errr finish_parse_object_property(parser *p)

{
  obj_property *poVar1;
  uint local_24;
  wchar_t idx;
  obj_property *n;
  obj_property *prop;
  parser *p_local;
  
  z_info->property_max = 0;
  for (n = (obj_property *)parser_priv(p); n != (obj_property *)0x0; n = n->next) {
    z_info->property_max = z_info->property_max + 1;
  }
  obj_properties = (obj_property *)mem_zalloc((long)(int)(z_info->property_max + 1) * 0xd8);
  local_24 = (uint)z_info->property_max;
  n = (obj_property *)parser_priv(p);
  while( true ) {
    if (n == (obj_property *)0x0) {
      z_info->property_max = z_info->property_max + 1;
      parser_destroy(p);
      return 0;
    }
    if ((int)local_24 < 1) break;
    memcpy(obj_properties + (int)local_24,n,0xd8);
    poVar1 = n->next;
    mem_free(n);
    local_24 = local_24 - 1;
    n = poVar1;
  }
  __assert_fail("idx > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                ,0xd75,"errr finish_parse_object_property(struct parser *)");
}

Assistant:

static errr finish_parse_object_property(struct parser *p) {
	struct obj_property *prop, *n;
	int idx;

	/* Scan the list for the max id */
	z_info->property_max = 0;
	prop = parser_priv(p);
	while (prop) {
		z_info->property_max++;
		prop = prop->next;
	}

	/* Allocate the direct access list and copy the data to it */
	obj_properties = mem_zalloc((z_info->property_max + 1) * sizeof(*prop));
	idx = z_info->property_max;
	for (prop = parser_priv(p); prop; prop = n, idx--) {
		assert(idx > 0);

		memcpy(&obj_properties[idx], prop, sizeof(*prop));
		n = prop->next;

		mem_free(prop);
	}
	z_info->property_max += 1;

	parser_destroy(p);
	return 0;
}